

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParamValueIntToFloatConversion.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferParamValueIntToFloatConversion::initTest
          (TextureBufferParamValueIntToFloatConversion *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  void *pvVar6;
  TestError *this_01;
  undefined4 extraout_XMM0_Db;
  double dVar7;
  char *local_68;
  char *csCode;
  string csSource;
  GLuint i;
  GLubyte *dataBuffer;
  long lStack_28;
  GLint max_workgroup_size;
  Functions *gl;
  TextureBufferParamValueIntToFloatConversion *local_10;
  TextureBufferParamValueIntToFloatConversion *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
               ,0x4a);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lStack_28 + 0x860))(0x91bf,0,(long)&dataBuffer + 4);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x52);
  dVar7 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,(float)dataBuffer._4_4_));
  dVar7 = std::floor(dVar7);
  m_work_group_x_size = de::min<unsigned_int>((uint)(long)SUB84(dVar7,0),0x10);
  m_texture_buffer_size = m_work_group_x_size * m_work_group_x_size;
  m_work_group_y_size = m_work_group_x_size;
  pvVar6 = operator_new__((ulong)m_texture_buffer_size);
  for (csSource.field_2._12_4_ = 0; (uint)csSource.field_2._12_4_ < m_texture_buffer_size;
      csSource.field_2._12_4_ = csSource.field_2._12_4_ + 1) {
    *(char *)((long)pvVar6 + (ulong)(uint)csSource.field_2._12_4_) = (char)csSource.field_2._12_4_;
  }
  (**(code **)(lStack_28 + 0x6c8))(1,&this->m_tbo_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x60);
  (**(code **)(lStack_28 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x62);
  (**(code **)(lStack_28 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,m_texture_buffer_size,pvVar6,
             0x88e5);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x65);
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  (**(code **)(lStack_28 + 0x6f8))(1,&this->m_tbo_tex_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x6b);
  (**(code **)(lStack_28 + 8))(0x84c0);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x6d);
  (**(code **)(lStack_28 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object to GL_TEXTURE_BUFFER_EXT target!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x6f);
  (**(code **)(lStack_28 + 0x12f8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8229,this->m_tbo_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error setting buffer object as texture buffer\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x72);
  GVar4 = (**(code **)(lStack_28 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x76);
  GVar4 = (**(code **)(lStack_28 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar4;
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x79);
  getComputeShaderCode_abi_cxx11_((string *)&csCode,this);
  local_68 = (char *)std::__cxx11::string::c_str();
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&local_68,(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not create a program object from valid compute shader object!",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
               ,0x80);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_28 + 0x6c8))(1,&this->m_ssbo_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x85);
  (**(code **)(lStack_28 + 0x40))(0x8892,this->m_ssbo_id);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error binding  buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x87);
  (**(code **)(lStack_28 + 0x150))(0x8892,(ulong)m_texture_buffer_size << 2,0,0x88ea);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x89);
  std::__cxx11::string::~string((string *)&csCode);
  return;
}

Assistant:

void TextureBufferParamValueIntToFloatConversion::initTest(void)
{
	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint max_workgroup_size;
	gl.getIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &max_workgroup_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!");

	m_work_group_x_size = m_work_group_y_size = de::min((glw::GLuint)floor(sqrt((float)max_workgroup_size)), 16u);
	m_texture_buffer_size					  = m_work_group_x_size * m_work_group_y_size;

	glw::GLubyte* dataBuffer = new glw::GLubyte[m_texture_buffer_size];

	for (glw::GLuint i = 0; i < m_texture_buffer_size; ++i)
	{
		dataBuffer[i] = (glw::GLubyte)i;
	}

	/* Create texture buffer object*/
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_texture_buffer_size * sizeof(glw::GLubyte), &dataBuffer[0],
				  GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	delete[] dataBuffer;

	/* Initialize texture buffer */
	gl.genTextures(1, &m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to GL_TEXTURE_BUFFER_EXT target!");

	gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, GL_R8, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as texture buffer's data store!");

	/* Create program */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode();
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create a program object from valid compute shader object!");
	}

	/* Create Shader Storage Buffer Object */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
	gl.bufferData(GL_ARRAY_BUFFER, m_texture_buffer_size * sizeof(glw::GLfloat), 0, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
}